

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count.hpp
# Opt level: O2

size_type trial::dynamic::key::count<std::allocator<char>,double>
                    (basic_variable<std::allocator<char>_> *self,double *other)

{
  bool bVar1;
  value vVar2;
  const_reference self_00;
  size_type sVar3;
  key_iterator it;
  key_iterator kStack_d8;
  key_iterator local_88;
  
  vVar2 = basic_variable<std::allocator<char>_>::symbol(self);
  if (vVar2 - boolean < 7) {
    bVar1 = detail::overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_double,_void>
            ::equal(self,other);
    sVar3 = (size_type)bVar1;
  }
  else if (vVar2 - array < 2) {
    basic_variable<std::allocator<char>_>::key_begin(&kStack_d8,self);
    sVar3 = 0;
    while( true ) {
      basic_variable<std::allocator<char>_>::key_end(&local_88,self);
      bVar1 = basic_variable<std::allocator<char>_>::key_iterator::operator!=(&kStack_d8,&local_88);
      basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_88);
      if (!bVar1) break;
      self_00 = basic_variable<std::allocator<char>_>::key_iterator::key(&kStack_d8);
      bVar1 = detail::
              overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_double,_void>::equal
                        (self_00,other);
      sVar3 = sVar3 + bVar1;
      basic_variable<std::allocator<char>_>::key_iterator::operator++(&kStack_d8);
    }
    basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&kStack_d8);
  }
  else {
    sVar3 = (size_type)vVar2;
  }
  return sVar3;
}

Assistant:

auto count(const basic_variable<Allocator>& self,
           const T& other) -> typename basic_variable<Allocator>::size_type
{
    switch (self.symbol())
    {
    case symbol::null:
        return 0;

    case symbol::boolean:
    case symbol::integer:
    case symbol::real:
    case symbol::string:
    case symbol::wstring:
    case symbol::u16string:
    case symbol::u32string:
        return (self == other) ? 1 : 0;

    case symbol::array:
    case symbol::map:
        {
            typename basic_variable<Allocator>::size_type result = 0;
            for (auto it = self.key_begin(); it != self.key_end(); ++it)
            {
                if (*it == other)
                    ++result;
            }
            return result;
        }
    }
    TRIAL_DYNAMIC_UNREACHABLE();
}